

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>
::local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
          (solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>
           *this,bit_array *x,row_value *it,int k,int selected,int r_size,float kappa,float delta)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  bool bVar9;
  float fVar10;
  
  lVar8 = *(long *)(this + 0x78);
  lVar6 = (long)k;
  fVar1 = *(float *)(lVar8 + lVar6 * 4);
  fVar2 = kappa / (1.0 - kappa) + delta;
  if (selected < 0) {
    *(float *)(lVar8 + lVar6 * 4) = fVar1 + **(float **)(this + 0x60) * 0.5;
    for (lVar8 = 0; (ulong)(uint)r_size * 0xc - lVar8 != 0; lVar8 = lVar8 + 0xc) {
      iVar4 = *(int *)(*(long *)(this + 0x60) + 4 + lVar8);
      bit_array_impl::unset(&x->super_bit_array_impl,it[iVar4].column);
      *(float *)(*(long *)(this + 0x50) + (long)it[iVar4].value * 4) =
           *(float *)(*(long *)(this + 0x50) + (long)it[iVar4].value * 4) - fVar2;
      fVar10 = solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
               ::local_compute_reduced_cost<baryonyx::bit_array>
                         ((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                           *)this,it[iVar4].column,x);
      if (fVar10 <= 0.0) {
        *(float *)(*(long *)(this + 0x50) + (long)it[iVar4].value * 4) =
             (fVar10 + *(float *)(*(long *)(this + 0x50) + (long)it[iVar4].value * 4)) - fVar2;
      }
    }
  }
  else {
    uVar7 = selected + 1;
    fVar10 = *(float *)(*(long *)(this + 0x60) + (ulong)(uint)selected * 0xc);
    if ((int)uVar7 < r_size) {
      lVar5 = (ulong)uVar7 * 0xc;
      *(float *)(lVar8 + lVar6 * 4) =
           fVar1 + (fVar10 + *(float *)(*(long *)(this + 0x60) + lVar5)) * 0.5;
      for (lVar8 = 0; lVar5 - lVar8 != 0; lVar8 = lVar8 + 0xc) {
        iVar4 = *(int *)(*(long *)(this + 0x60) + 4 + lVar8);
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar4].column);
        *(float *)(*(long *)(this + 0x50) + (long)it[iVar4].value * 4) =
             fVar2 + *(float *)(*(long *)(this + 0x50) + (long)it[iVar4].value * 4);
        fVar10 = solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                 ::local_compute_reduced_cost<baryonyx::bit_array>
                           ((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                             *)this,it[iVar4].column,x);
        if (0.0 <= fVar10) {
          *(float *)(*(long *)(this + 0x50) + (long)it[iVar4].value * 4) =
               (*(float *)(*(long *)(this + 0x50) + (long)it[iVar4].value * 4) - fVar10) + fVar2;
        }
      }
      lVar5 = lVar5 + 4;
      lVar8 = (ulong)(uint)r_size - (ulong)uVar7;
      while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
        iVar4 = *(int *)(*(long *)(this + 0x60) + lVar5);
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar4].column);
        *(float *)(*(long *)(this + 0x50) + (long)it[iVar4].value * 4) =
             *(float *)(*(long *)(this + 0x50) + (long)it[iVar4].value * 4) - fVar2;
        fVar10 = solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                 ::local_compute_reduced_cost<baryonyx::bit_array>
                           ((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                             *)this,it[iVar4].column,x);
        if (fVar10 <= 0.0) {
          *(float *)(*(long *)(this + 0x50) + (long)it[iVar4].value * 4) =
               (fVar10 + *(float *)(*(long *)(this + 0x50) + (long)it[iVar4].value * 4)) - fVar2;
        }
        lVar5 = lVar5 + 0xc;
      }
    }
    else {
      auVar3 = vfmadd132ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar1),ZEXT416(0x3fc00000));
      *(int *)(lVar8 + lVar6 * 4) = auVar3._0_4_;
      for (lVar8 = 0; (ulong)(uint)r_size * 0xc - lVar8 != 0; lVar8 = lVar8 + 0xc) {
        iVar4 = *(int *)(*(long *)(this + 0x60) + 4 + lVar8);
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar4].column);
        *(float *)(*(long *)(this + 0x50) + (long)it[iVar4].value * 4) =
             fVar2 + *(float *)(*(long *)(this + 0x50) + (long)it[iVar4].value * 4);
        fVar10 = solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                 ::local_compute_reduced_cost<baryonyx::bit_array>
                           ((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                             *)this,it[iVar4].column,x);
        if (0.0 <= fVar10) {
          *(float *)(*(long *)(this + 0x50) + (long)it[iVar4].value * 4) =
               (*(float *)(*(long *)(this + 0x50) + (long)it[iVar4].value * 4) - fVar10) + fVar2;
        }
      }
    }
  }
  bVar9 = is_valid_constraint<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array>
                    ((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                      *)this,k,x);
  if (bVar9) {
    iVar4 = vmovmskps_avx(ZEXT416((uint)fVar1));
    return (bool)((byte)((byte)((uint)(iVar4 << 0x1f) >> 0x18) ^
                        (byte)((uint)*(undefined4 *)(*(long *)(this + 0x78) + lVar6 * 4) >> 0x18))
                 >> 7);
  }
  details::fail_fast("Precondition","is_valid_constraint(*this, k, x)",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-Z.cpp"
                     ,"436");
}

Assistant:

bool local_affect(Xtype& x,
                      Iterator it,
                      int k,
                      int selected,
                      int r_size,
                      const Float kappa,
                      const Float delta)
    {
        constexpr Float one{ 1 };
        constexpr Float two{ 2 };
        constexpr Float middle{ (two + one) / two };

        const auto old_pi = pi[k];

        auto d = (kappa / (one - kappa)) + delta;

        if (selected < 0) {
            pi[k] += R[0].value / two;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[0].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        } else if (selected + 1 >= r_size) {
            pi[k] += R[selected].value * middle;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }
        } else {
            pi[k] += ((R[selected].value + R[selected + 1].value) / two);

            logger::log("    selected: {}/{} ({}x{})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        R[selected + 1].value,
                        pi[k]);

            int i = 0;
            for (; i <= selected; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }

            for (; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        }

        // TODO job: develops is_valid_constraint for all the solvers
        bx_expects(is_valid_constraint(*this, k, x));

        return is_signbit_change(old_pi, pi[k]);
    }